

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbfUdpMulticast.c
# Opt level: O2

sbfError sbfUdpMulticast_send(sbfUdpMulticast s,void *buf,size_t len)

{
  int iVar1;
  size_t sVar2;
  int *piVar3;
  
  sVar2 = sendto(s->mSocket,buf,len,0,(sockaddr *)&s->mAddress,0x10);
  if ((long)sVar2 < 0) {
    piVar3 = __errno_location();
    iVar1 = *piVar3;
  }
  else {
    iVar1 = (uint)(sVar2 != len) * 5;
  }
  return iVar1;
}

Assistant:

sbfError
sbfUdpMulticast_send (sbfUdpMulticast s, const void* buf, size_t len)
{
#ifdef WIN32
    int sent;
#else
    ssize_t sent;
#endif

    sent = sendto (s->mSocket,
                   buf,
                   len,
                   0,
                   (struct sockaddr*)&s->mAddress,
                   sizeof s->mAddress);
    if (sent < 0)
        return errno;
    if ((size_t)sent != len)
        return EIO;
    return 0;
}